

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::PageSegmentBase
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,
          PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          *allocator,bool committed,bool allocated,bool enableWriteBarrier)

{
  PageBitVector *this_00;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  BVIndex BVar7;
  ulong uVar8;
  undefined4 *puVar9;
  PageAllocatorBaseCommon *pPVar10;
  
  uVar2 = allocator->maxAllocPageCount;
  pPVar10 = &allocator->super_PageAllocatorBaseCommon;
  if (allocator ==
      (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
       *)0x0) {
    pPVar10 = (PageAllocatorBaseCommon *)0x0;
  }
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).super_SegmentBaseCommon.
  allocator = pPVar10;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).trailingGuardPageCount = 0;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).leadingGuardPageCount = 0;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).secondaryAllocator =
       (SecondaryAllocator *)0x0;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address = (char *)0x0;
  uVar3 = allocator->secondaryAllocPageCount;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).secondaryAllocPageCount = uVar3;
  bVar1 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).field_0x2c;
  uVar8 = (ulong)uVar2 + (ulong)uVar3;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).segmentPageCount = uVar8;
  this->decommitPageCount = 0;
  (this->freePages).data[0].word = 0;
  (this->freePages).data[1].word = 0;
  (this->freePages).data[2].word = 0;
  (this->freePages).data[3].word = 0;
  (this->freePages).data[4].word = 0;
  (this->decommitPages).data[0].word = 0;
  (this->decommitPages).data[1].word = 0;
  (this->decommitPages).data[2].word = 0;
  (this->decommitPages).data[3].word = 0;
  (this->decommitPages).data[4].word = 0;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).field_0x2c =
       bVar1 & 0xf8 | enableWriteBarrier * '\x02' | 4;
  if (uVar8 != allocator->secondaryAllocPageCount + allocator->maxAllocPageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xe0,
                       "(this->segmentPageCount == allocator->maxAllocPageCount + allocator->secondaryAllocPageCount)"
                       ,
                       "this->segmentPageCount == allocator->maxAllocPageCount + allocator->secondaryAllocPageCount"
                      );
    if (!bVar5) goto LAB_00703599;
    *puVar9 = 0;
  }
  this_00 = &this->freePages;
  if (committed) {
    if (allocated) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xe6,"(!allocated)","!allocated");
      if (!bVar5) goto LAB_00703599;
      *puVar9 = 0;
    }
    uVar6 = GetAvailablePageCount(this);
    this->freePageCount = uVar6;
    BVStatic<272UL>::SetRange(this_00,0,uVar6);
    BVar7 = this->freePageCount;
    if (BVar7 != 0x110) {
      BVStatic<272UL>::ClearRange(this_00,BVar7,0x110 - BVar7);
    }
    BVar7 = BVStatic<272UL>::Count(this_00);
    if (BVar7 != this->freePageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xee,"(this->GetCountOfFreePages() == this->freePageCount)",
                         "this->GetCountOfFreePages() == this->freePageCount");
      if (!bVar5) {
LAB_00703599:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
  }
  else {
    this->freePageCount = 0;
    (this->freePages).data[2].word = 0;
    (this->freePages).data[3].word = 0;
    this_00->data[0].word = 0;
    (this->freePages).data[1].word = 0;
    (this->freePages).data[4].word = 0;
    if (!allocated) {
      uVar6 = GetAvailablePageCount(this);
      this->decommitPageCount = uVar6;
      BVStatic<272UL>::SetRange(&this->decommitPages,0,uVar6);
      BVar7 = this->decommitPageCount;
      if (BVar7 != 0x110) {
        BVStatic<272UL>::ClearRange(&this->decommitPages,BVar7,0x110 - BVar7);
      }
    }
  }
  return;
}

Assistant:

PageSegmentBase<T>::PageSegmentBase(PageAllocatorBase<T> * allocator, bool committed, bool allocated, bool enableWriteBarrier) :
    SegmentBase<T>(allocator, allocator->maxAllocPageCount, enableWriteBarrier), decommitPageCount(0)
{
#if DBG
    this->isPageSegment = true;
#endif // DBG
    Assert(this->segmentPageCount == allocator->maxAllocPageCount + allocator->secondaryAllocPageCount);

    uint maxPageCount = GetMaxPageCount();

    if (committed)
    {
        Assert(!allocated);
        this->freePageCount = this->GetAvailablePageCount();
        this->SetRangeInFreePagesBitVector(0, this->freePageCount);
        if (this->freePageCount != maxPageCount)
        {
            this->ClearRangeInFreePagesBitVector(this->freePageCount, (maxPageCount - this->freePageCount));
        }

        Assert(this->GetCountOfFreePages() == this->freePageCount);
    }
    else
    {
        this->freePageCount = 0;
        this->ClearAllInFreePagesBitVector();
        if (!allocated)
        {
            this->decommitPageCount = this->GetAvailablePageCount();
            this->SetRangeInDecommitPagesBitVector(0, this->decommitPageCount);

            if (this->decommitPageCount != maxPageCount)
            {
                this->ClearRangeInDecommitPagesBitVector(this->decommitPageCount, (maxPageCount - this->decommitPageCount));
            }
        }
    }
}